

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> * __thiscall
Clara::CommandLine<Catch::ConfigData>::parseInto
          (CommandLine<Catch::ConfigData> *this,int argc,char **argv,ConfigData *config)

{
  long lVar1;
  undefined8 *in_RCX;
  ConfigData *in_RDI;
  Parser parser;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> tokens;
  size_t lastSlash;
  string processName;
  ConfigData *this_00;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *this_01;
  Parser *in_stack_ffffffffffffff40;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *in_stack_ffffffffffffff68;
  char **in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Parser *in_stack_ffffffffffffff80;
  CommandLine<Catch::ConfigData> *in_stack_ffffffffffffff88;
  allocator local_49;
  string local_48 [72];
  
  this_01 = (vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *)*in_RCX;
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,(char *)this_01,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  lVar1 = std::__cxx11::string::find_last_of((char *)local_48,0x1f6b21);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffff78,(ulong)local_48);
    std::__cxx11::string::operator=(local_48,(string *)&stack0xffffffffffffff78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  }
  Detail::BoundArgFunction<Catch::ConfigData>::set
            ((BoundArgFunction<Catch::ConfigData> *)this_00,in_RDI,(string *)0x1bc1ae);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::vector
            ((vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *)0x1bc1ba);
  Parser::Parser(in_stack_ffffffffffffff40);
  Parser::parseIntoTokens
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  populate(in_stack_ffffffffffffff88,
           (vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *)
           in_stack_ffffffffffffff80,
           (ConfigData *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  Parser::~Parser((Parser *)0x1bc20d);
  std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::~vector(this_01);
  std::__cxx11::string::~string(local_48);
  return (vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *)this_00;
}

Assistant:

std::vector<Parser::Token> parseInto( int argc, char const * const * argv, ConfigT& config ) const {
            std::string processName = argv[0];
            std::size_t lastSlash = processName.find_last_of( "/\\" );
            if( lastSlash != std::string::npos )
                processName = processName.substr( lastSlash+1 );
            m_boundProcessName.set( config, processName );
            std::vector<Parser::Token> tokens;
            Parser parser;
            parser.parseIntoTokens( argc, argv, tokens );
            return populate( tokens, config );
        }